

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.cpp
# Opt level: O0

bool __thiscall Utility::Typer::type_next_character(Typer *this)

{
  size_t sVar1;
  uint16_t uVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 extraout_RDX;
  undefined1 auVar5 [16];
  uint16_t key_pressed;
  Typer *this_local;
  
  sVar1 = this->string_pointer_;
  sVar4 = std::__cxx11::string::size();
  if (sVar1 == sVar4) {
    this_local._7_1_ = false;
  }
  else {
    do {
      uVar2 = try_type_next_character(this);
      auVar5._8_8_ = extraout_RDX;
      auVar5._0_8_ = sVar4;
      if (uVar2 == 0) {
        this->phase_ = 0;
        this->string_pointer_ = this->string_pointer_ + 1;
        sVar1 = this->string_pointer_;
        auVar5 = std::__cxx11::string::size();
        if (sVar1 == auVar5._0_8_) {
          return false;
        }
      }
      sVar4 = CONCAT62(auVar5._2_6_,uVar2);
      uVar3 = (*this->character_mapper_->_vptr_CharacterMapper[4])
                        (this->character_mapper_,(ulong)uVar2,auVar5._8_8_,sVar4);
    } while ((uVar3 & 1) == 0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Typer::type_next_character() {
	if(string_pointer_ == string_.size()) return false;

	while(true) {
		const uint16_t key_pressed = try_type_next_character();

		if(!key_pressed) {
			phase_ = 0;
			++string_pointer_;
			if(string_pointer_ == string_.size()) return false;
		}

		if(character_mapper_.needs_pause_after_key(key_pressed)) {
			break;
		}
	}

	return true;
}